

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m4vd_vdpu1.c
# Opt level: O0

MPP_RET vdpu1_mpg4d_deinit(void *hal)

{
  hal_mpg4_ctx *ctx;
  MPP_RET ret;
  void *hal_local;
  
  if ((hal == (void *)0x0) &&
     (_mpp_log_l(2,"hal_m4vd_vdpu1","Assertion %s failed at %s:%d\n",(char *)0x0,"hal",
                 "vdpu1_mpg4d_deinit",0x134), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (*(long *)((long)hal + 0x48) != 0) {
    mpp_osal_free("vdpu1_mpg4d_deinit",*(void **)((long)hal + 0x48));
    *(undefined8 *)((long)hal + 0x48) = 0;
  }
  if (*(long *)((long)hal + 0x40) != 0) {
    mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x40),"vdpu1_mpg4d_deinit");
    *(undefined8 *)((long)hal + 0x40) = 0;
  }
  if (*(long *)((long)hal + 0x38) != 0) {
    mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x38),"vdpu1_mpg4d_deinit");
    *(undefined8 *)((long)hal + 0x38) = 0;
  }
  if (*(long *)((long)hal + 0x10) != 0) {
    mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x10));
    *(undefined8 *)((long)hal + 0x10) = 0;
  }
  if (*(long *)((long)hal + 0x20) != 0) {
    mpp_dev_deinit(*(MppDev *)((long)hal + 0x20));
    *(undefined8 *)((long)hal + 0x20) = 0;
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu1_mpg4d_deinit(void *hal)
{
    MPP_RET ret = MPP_OK;
    hal_mpg4_ctx *ctx = (hal_mpg4_ctx *)hal;

    mpp_assert(hal);

    if (ctx->regs) {
        mpp_free(ctx->regs);
        ctx->regs = NULL;
    }

    if (ctx->qp_table) {
        mpp_buffer_put(ctx->qp_table);
        ctx->qp_table = NULL;
    }

    if (ctx->mv_buf) {
        mpp_buffer_put(ctx->mv_buf);
        ctx->mv_buf = NULL;
    }

    if (ctx->group) {
        mpp_buffer_group_put(ctx->group);
        ctx->group = NULL;
    }

    if (ctx->dev) {
        mpp_dev_deinit(ctx->dev);
        ctx->dev = NULL;
    }

    return ret;
}